

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

int mz_zip_reader_locate_file_binary_search(mz_zip_archive *pZip,char *pFilename)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  byte *pbVar9;
  byte *in_RSI;
  long in_RDI;
  int comp;
  int file_index;
  int m;
  int h;
  int l;
  mz_uint filename_len;
  int size;
  mz_uint32 *pIndices;
  mz_zip_array *pCentral_dir;
  mz_zip_array *pCentral_dir_offsets;
  mz_zip_internal_state *pState;
  mz_uint8 r;
  mz_uint8 l_1;
  mz_uint l_len;
  mz_uint8 *pE;
  mz_uint8 *pL;
  int local_b4;
  uint local_a4;
  int local_88;
  int local_84;
  byte local_3e;
  byte local_3d;
  byte *local_30;
  byte *local_20;
  
  plVar2 = *(long **)(in_RDI + 0x58);
  lVar3 = plVar2[8];
  local_88 = *(int *)(in_RDI + 0x10);
  sVar7 = strlen((char *)in_RSI);
  uVar4 = (uint)sVar7;
  local_84 = 0;
  local_88 = local_88 + -1;
  do {
    if (local_88 < local_84) {
      return -1;
    }
    iVar5 = local_84 + local_88 >> 1;
    uVar1 = *(uint *)(lVar3 + (long)iVar5 * 4);
    lVar8 = *plVar2 + (ulong)*(uint *)(plVar2[4] + (ulong)uVar1 * 4);
    uVar6 = (uint)*(ushort *)(lVar8 + 0x1c);
    local_3d = 0;
    local_3e = 0;
    local_30 = (byte *)(lVar8 + 0x2e);
    local_a4 = uVar4;
    if (uVar6 < uVar4) {
      local_a4 = uVar6;
    }
    pbVar9 = local_30 + local_a4;
    local_20 = in_RSI;
    for (; local_30 < pbVar9; local_30 = local_30 + 1) {
      if ((*local_30 < 0x41) || (0x5a < *local_30)) {
        local_3d = *local_30;
      }
      else {
        local_3d = *local_30 + 0x20;
      }
      if (((char)*local_20 < 'A') || ('Z' < (char)*local_20)) {
        local_3e = *local_20;
      }
      else {
        local_3e = *local_20 + 0x20;
      }
      if (local_3d != local_3e) break;
      local_20 = local_20 + 1;
    }
    if (local_30 == pbVar9) {
      local_b4 = uVar6 - uVar4;
    }
    else {
      local_b4 = (uint)local_3d - (uint)local_3e;
    }
    if (local_b4 == 0) {
      return uVar1;
    }
    if (local_b4 < 0) {
      local_84 = iVar5 + 1;
    }
    else {
      local_88 = iVar5 + -1;
    }
  } while( true );
}

Assistant:

static int mz_zip_reader_locate_file_binary_search(mz_zip_archive *pZip, const char *pFilename)
{
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  const mz_uint filename_len = (mz_uint)strlen(pFilename);
  int l = 0, h = size - 1;
  while (l <= h)
  {
    int m = (l + h) >> 1, file_index = pIndices[m], comp = mz_zip_reader_filename_compare(pCentral_dir, pCentral_dir_offsets, file_index, pFilename, filename_len);
    if (!comp)
      return file_index;
    else if (comp < 0)
      l = m + 1;
    else
      h = m - 1;
  }
  return -1;
}